

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void TR_Stmt(ast *node)

{
  int iVar1;
  ast *node_00;
  ast *paVar2;
  IrSim *this;
  IrSim *this_00;
  IrSim *ic;
  ast *in_RDI;
  Operand t1;
  Operand label3;
  Operand label2;
  Operand label1;
  ast *c7;
  ast *c1;
  C_IC *in_stack_fffffffffffff748;
  IrSim *in_stack_fffffffffffff750;
  IrSim *in_stack_fffffffffffff758;
  C_OP *in_stack_fffffffffffff768;
  ast *in_stack_fffffffffffff770;
  IrSim *in_stack_fffffffffffff7b8;
  C_OP *in_stack_fffffffffffffaf0;
  C_OP *in_stack_fffffffffffffaf8;
  ast *in_stack_fffffffffffffb00;
  
  node_00 = child(in_RDI,1);
  Operand::Operand((Operand *)in_stack_fffffffffffff750);
  Operand::Operand((Operand *)in_stack_fffffffffffff750);
  Operand::Operand((Operand *)in_stack_fffffffffffff750);
  Operand::Operand((Operand *)in_stack_fffffffffffff750);
  iVar1 = node_00->type;
  if (iVar1 == -0x2704) {
    TR_CompSt((ast *)0x115570);
  }
  else if (iVar1 == -0x26fd) {
    TR_Exp(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  }
  else if (iVar1 == 0x118) {
    IrSim::newTmpVar(in_stack_fffffffffffff7b8);
    Operand::operator=((Operand *)in_stack_fffffffffffff750,(Operand *)in_stack_fffffffffffff748);
    Operand::~Operand((Operand *)0x1155b1);
    child(in_RDI,2);
    TR_Exp(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    IrSim::icReturn(in_stack_fffffffffffff758,(C_OP *)in_stack_fffffffffffff750);
    IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
  }
  else if (iVar1 == 0x119) {
    IrSim::newLabel(in_stack_fffffffffffff7b8);
    Operand::operator=((Operand *)in_stack_fffffffffffff750,(Operand *)in_stack_fffffffffffff748);
    Operand::~Operand((Operand *)0x115684);
    IrSim::newLabel(in_stack_fffffffffffff7b8);
    Operand::operator=((Operand *)in_stack_fffffffffffff750,(Operand *)in_stack_fffffffffffff748);
    Operand::~Operand((Operand *)0x1156be);
    child(in_RDI,3);
    TR_Cond(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    IrSim::icLabel(in_stack_fffffffffffff758,(C_OP *)in_stack_fffffffffffff750);
    IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
    child(in_RDI,5);
    TR_Stmt(node_00);
    paVar2 = child(in_RDI,7);
    if (paVar2 == (ast *)0x0) {
      IrSim::icLabel(in_stack_fffffffffffff758,(C_OP *)in_stack_fffffffffffff750);
      IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
    }
    else {
      IrSim::newLabel(in_stack_fffffffffffff7b8);
      Operand::operator=((Operand *)in_stack_fffffffffffff750,(Operand *)in_stack_fffffffffffff748);
      Operand::~Operand((Operand *)0x115865);
      IrSim::icGoto(in_stack_fffffffffffff758,(C_OP *)in_stack_fffffffffffff750);
      IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      IrSim::icLabel(in_stack_fffffffffffff758,(C_OP *)in_stack_fffffffffffff750);
      IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
      InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
      TR_Stmt(node_00);
      IrSim::icLabel(in_stack_fffffffffffff758,(C_OP *)in_stack_fffffffffffff750);
      IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
    }
  }
  else {
    if (iVar1 != 0x11b) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                    ,0x2b3,"void TR_Stmt(ast *)");
    }
    IrSim::newLabel(in_stack_fffffffffffff7b8);
    Operand::operator=((Operand *)in_stack_fffffffffffff750,(Operand *)in_stack_fffffffffffff748);
    Operand::~Operand((Operand *)0x1159e5);
    IrSim::newLabel(in_stack_fffffffffffff7b8);
    Operand::operator=((Operand *)in_stack_fffffffffffff750,(Operand *)in_stack_fffffffffffff748);
    Operand::~Operand((Operand *)0x115a1f);
    IrSim::newLabel(in_stack_fffffffffffff7b8);
    Operand::operator=((Operand *)in_stack_fffffffffffff750,(Operand *)in_stack_fffffffffffff748);
    Operand::~Operand((Operand *)0x115a59);
    IrSim::icLabel(in_stack_fffffffffffff758,(C_OP *)in_stack_fffffffffffff750);
    IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
    this = (IrSim *)child(in_RDI,3);
    TR_Cond(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    IrSim::icLabel(this,(C_OP *)in_stack_fffffffffffff750);
    IrSim::operator<<(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffff750);
    this_00 = (IrSim *)child(in_RDI,5);
    TR_Stmt(node_00);
    IrSim::icGoto(this,(C_OP *)this_00);
    ic = IrSim::operator<<(this_00,in_stack_fffffffffffff748);
    IrSim::icLabel(this,(C_OP *)this_00);
    IrSim::operator<<(this_00,(C_IC *)ic);
    InterCode::~InterCode((InterCode *)this_00);
    InterCode::~InterCode((InterCode *)this_00);
  }
  Operand::~Operand((Operand *)0x115c86);
  Operand::~Operand((Operand *)0x115c93);
  Operand::~Operand((Operand *)0x115ca0);
  Operand::~Operand((Operand *)0x115cad);
  return;
}

Assistant:

static void TR_Stmt(ast *node) {
    ast *c1 = child(node, 1), *c7;
    Operand label1, label2, label3, t1;
    switch (c1->type) {
        case Exp:    TR_Exp(c1, OP_NONE); break;
        case CompSt: TR_CompSt(c1);       break;
        case RETURN:
            t1 = irSim.newTmpVar();
            TR_Exp(child(node, 2), t1);
            irSim << irSim.icReturn(t1);
            break;
        case IF:
            label1 = irSim.newLabel();
            label2 = irSim.newLabel();
            TR_Cond(child(node, 3), label1, label2);
            irSim << irSim.icLabel(label1);
            TR_Stmt(child(node, 5));
            if (!(c7 = child(node, 7))) { // without ELSE node
                irSim << irSim.icLabel(label2);
                return;
            }
            label3 = irSim.newLabel();
            irSim << irSim.icGoto(label3) << irSim.icLabel(label2);
            TR_Stmt(c7);
            irSim << irSim.icLabel(label3);
            break;
        case WHILE:
            label1 = irSim.newLabel();
            label2 = irSim.newLabel();
            label3 = irSim.newLabel();
            irSim << irSim.icLabel(label1);
            TR_Cond(child(node, 3), label2, label3);
            irSim << irSim.icLabel(label2);
            TR_Stmt(child(node, 5));
            irSim << irSim.icGoto(label1) << irSim.icLabel(label3);
            break;
        default: assert(false); break;
    }
}